

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamespaceScope.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::NamespaceScope::addPrefix(NamespaceScope *this,XMLCh *prefixToAdd,uint uriId)

{
  StackElem *toExpand;
  PrefMapElem *pPVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  EmptyStackException *this_00;
  ulong uVar5;
  
  if (this->fStackTop == 0) {
    this_00 = (EmptyStackException *)__cxa_allocate_exception(0x30);
    EmptyStackException::EmptyStackException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/NamespaceScope.cpp"
               ,0x9e,ElemStack_EmptyStack,this->fMemoryManager);
    __cxa_throw(this_00,&EmptyStackException::typeinfo,XMLException::~XMLException);
  }
  toExpand = this->fStack[this->fStackTop - 1];
  uVar3 = XMLStringPool::addOrFind(&this->fPrefixPool,prefixToAdd);
  uVar4 = (ulong)toExpand->fMapCount;
  uVar2 = 0;
  do {
    uVar5 = uVar2;
    if (uVar4 == uVar5) {
      if (toExpand->fMapCount == toExpand->fMapCapacity) {
        expandMap(this,toExpand);
        uVar4 = (ulong)toExpand->fMapCount;
      }
      pPVar1 = toExpand->fMap;
      pPVar1[uVar4].fPrefId = uVar3;
      pPVar1[uVar4].fURIId = uriId;
      toExpand->fMapCount = (int)uVar4 + 1;
      return;
    }
    uVar2 = uVar5 + 1;
  } while (toExpand->fMap[uVar5].fPrefId != uVar3);
  toExpand->fMap[uVar5].fURIId = uriId;
  return;
}

Assistant:

void NamespaceScope::addPrefix(const XMLCh* const prefixToAdd,
                               const unsigned int uriId) {

    if (!fStackTop)
        ThrowXMLwithMemMgr(EmptyStackException, XMLExcepts::ElemStack_EmptyStack, fMemoryManager);

    // Get a convenience pointer to the stack top row
    StackElem* curRow = fStack[fStackTop - 1];

    // Map the prefix to its unique id
    const unsigned int prefId = fPrefixPool.addOrFind(prefixToAdd);

    // Search the map at this level for the passed prefix
    for (unsigned int mapIndex = 0; mapIndex < curRow->fMapCount; mapIndex++)
    {
        if (curRow->fMap[mapIndex].fPrefId == prefId)
        {
            curRow->fMap[mapIndex].fURIId = uriId;
            return;
        }
    }

    //
    //  Add a new element to the prefix map for this element. If its full,
    //  then expand it out.
    //
    if (curRow->fMapCount == curRow->fMapCapacity)
        expandMap(curRow);

    //
    //  And now add a new element for this prefix.
    //
    curRow->fMap[curRow->fMapCount].fPrefId = prefId;
    curRow->fMap[curRow->fMapCount].fURIId = uriId;

    // Bump the map count now
    curRow->fMapCount++;
}